

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpdflogger-c.cc
# Opt level: O1

void set_log_dest(QPDFLogger *l,offset_in_QPDFLogger_to_subr method,qpdf_log_dest_e dest,
                 char *identifier,qpdf_log_fn_t fn,void *udata)

{
  _Any_data local_58;
  code *local_48;
  code *pcStack_40;
  
  local_48 = (code *)0x0;
  pcStack_40 = (code *)0x0;
  local_58._M_unused._M_object = (void *)0x0;
  local_58._8_8_ = 0;
  local_58._M_unused._M_object = operator_new(0x18);
  *(offset_in_QPDFLogger_to_subr *)local_58._M_unused._0_8_ = method;
  *(offset_in_QPDFLogger_to_subr *)((long)local_58._M_unused._0_8_ + 8) = 0;
  *(QPDFLogger **)((long)local_58._M_unused._0_8_ + 0x10) = l;
  pcStack_40 = std::
               _Function_handler<void_(std::shared_ptr<Pipeline>),_std::_Bind<std::_Mem_fn<void_(QPDFLogger::*)(std::shared_ptr<Pipeline>)>_(QPDFLogger_*,_std::_Placeholder<1>)>_>
               ::_M_invoke;
  local_48 = std::
             _Function_handler<void_(std::shared_ptr<Pipeline>),_std::_Bind<std::_Mem_fn<void_(QPDFLogger::*)(std::shared_ptr<Pipeline>)>_(QPDFLogger_*,_std::_Placeholder<1>)>_>
             ::_M_manager;
  set_log_dest(l,(function<void_(std::shared_ptr<Pipeline>)> *)&local_58,dest,identifier,fn,udata);
  if (local_48 != (code *)0x0) {
    (*local_48)(&local_58,&local_58,__destroy_functor);
  }
  return;
}

Assistant:

static void
set_log_dest(
    QPDFLogger* l,
    void (QPDFLogger::*method)(std::shared_ptr<Pipeline>),
    qpdf_log_dest_e dest,
    char const* identifier,
    qpdf_log_fn_t fn,
    void* udata)
{
    set_log_dest(
        l, std::bind(std::mem_fn(method), l, std::placeholders::_1), dest, identifier, fn, udata);
}